

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void lyplg_ext_compile_log
               (lysc_ctx *cctx,lysc_ext_instance *ext,LY_LOG_LEVEL level,LY_ERR err,char *format,...
               )

{
  char in_AL;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [40];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  char *local_50;
  char *schema_path;
  va_list ap;
  char *format_local;
  LY_ERR err_local;
  LY_LOG_LEVEL level_local;
  lysc_ext_instance *ext_local;
  lysc_ctx *cctx_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_50 = (char *)0x0;
  local_e0 = in_R9;
  if ((cctx != (lysc_ctx *)0x0) && (local_50 = strdup(cctx->path), local_50 == (char *)0x0)) {
    ly_log(cctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_ext_compile_log");
    return;
  }
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  schema_path._4_4_ = 0x30;
  schema_path._0_4_ = 0x28;
  ly_ext_log(ext->module->ctx,ext->def->plugin->id,level,err,(char *)0x0,local_50,0,format,
             (__va_list_tag *)&schema_path);
  return;
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_compile_log(const struct lysc_ctx *cctx, const struct lysc_ext_instance *ext, LY_LOG_LEVEL level, LY_ERR err,
        const char *format, ...)
{
    va_list ap;
    char *schema_path = NULL;

    if (cctx && !(schema_path = strdup(cctx->path))) {
        LOGMEM(cctx->ctx);
        return;
    }

    va_start(ap, format);
    ly_ext_log(ext->module->ctx, ext->def->plugin->id, level, err, NULL, schema_path, 0, format, ap);
    va_end(ap);
}